

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogPipe.cpp
# Opt level: O0

void __thiscall liblogger::LogPipe::Log(LogPipe *this,LogType Type,string *str)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  size_t sVar4;
  undefined8 uVar5;
  ostream *poVar6;
  int *piVar7;
  char *pcVar8;
  LogException *this_00;
  string *message;
  LogType in_ESI;
  long in_RDI;
  stringstream ss_1;
  stringstream ss;
  char buf [128];
  tm timeinfo;
  time_t current;
  string *in_stack_fffffffffffffb28;
  LogException *in_stack_fffffffffffffb30;
  allocator<char> *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  FILE *__stream;
  stringstream local_450 [16];
  ostream local_440 [383];
  undefined1 local_2c1;
  stringstream local_2a0 [16];
  ostream local_290 [376];
  char local_118 [136];
  tm local_90;
  time_t local_58;
  undefined1 local_4d;
  LogType local_c;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    local_4d = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    LogException::LogException(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    local_4d = 0;
    __cxa_throw(uVar3,&LogException::typeinfo,LogException::~LogException);
  }
  local_c = in_ESI;
  local_58 = time((time_t *)0x0);
  localtime_r(&local_58,&local_90);
  sVar4 = strftime(local_118,0x80,"%F %T",&local_90);
  if (sVar4 == 0) {
    abort();
  }
  __stream = *(FILE **)(in_RDI + 0x28);
  LogTypeToStr_abi_cxx11_(local_c);
  uVar3 = std::__cxx11::string::c_str();
  uVar1 = getpid();
  uVar5 = std::__cxx11::string::c_str();
  iVar2 = fprintf(__stream,"%s - %s [PID: %d] - %s\n",local_118,uVar3,(ulong)uVar1,uVar5);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_2a0);
    poVar6 = std::operator<<(local_290,"failed to write to pipe \'");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 8));
    poVar6 = std::operator<<(poVar6,"\' error:");
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    std::operator<<(poVar6,pcVar8);
    local_2c1 = 1;
    this_00 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(this_00,in_stack_fffffffffffffb28);
    local_2c1 = 0;
    __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
  }
  iVar2 = fflush(*(FILE **)(in_RDI + 0x28));
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_450);
    message = (string *)std::operator<<(local_440,"failed to flush to pipe \'");
    poVar6 = std::operator<<((ostream *)message,(string *)(in_RDI + 8));
    poVar6 = std::operator<<(poVar6,"\' error:");
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    std::operator<<(poVar6,pcVar8);
    uVar3 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffffb30,message);
    __cxa_throw(uVar3,&LogException::typeinfo,LogException::~LogException);
  }
  return;
}

Assistant:

void LogPipe::Log(const LogType Type, const std::string &str) {
	if (m_fp == NULL)
		throw(LogException("Pipe not open"));

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
		abort(); //Bug

	if (fprintf(m_fp, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to pipe '" << m_command << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(m_fp) < 0)
	{
		std::stringstream ss;
		ss << "failed to flush to pipe '" << m_command << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}